

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

Instr * IR::Instr::CloneRange
                  (Instr *instrStart,Instr *instrLast,Instr *instrAfter,Lowerer *lowerer,
                  JitArenaAllocator *alloc,_func_bool_Instr_ptr *fMapTest,
                  bool clonedInstrGetOrigArgSlotSym)

{
  code *pcVar1;
  byte bVar2;
  bool bVar3;
  Cloner *pCVar4;
  undefined4 *puVar5;
  InstrMap *this;
  Instr *local_90;
  LabelInstr *local_80;
  LabelInstr *local_78;
  LabelInstr *instrLabel;
  Instr *instrClone;
  Instr *instr;
  Instr *instrStop;
  Instr *__prevInstrCheck;
  Func *topFunc;
  Instr *instrReturn;
  _func_bool_Instr_ptr *p_Stack_38;
  bool clonedInstrGetOrigArgSlotSym_local;
  _func_bool_Instr_ptr *fMapTest_local;
  JitArenaAllocator *alloc_local;
  Lowerer *lowerer_local;
  Instr *instrAfter_local;
  Instr *instrLast_local;
  Instr *instrStart_local;
  
  instrReturn._7_1_ = clonedInstrGetOrigArgSlotSym;
  topFunc = (Func *)instrAfter;
  p_Stack_38 = fMapTest;
  fMapTest_local = (_func_bool_Instr_ptr *)alloc;
  alloc_local = (JitArenaAllocator *)lowerer;
  lowerer_local = (Lowerer *)instrAfter;
  instrAfter_local = instrLast;
  instrLast_local = instrStart;
  __prevInstrCheck = (Instr *)Func::GetTopFunc(instrStart->m_func);
  Func::BeginClone((Func *)__prevInstrCheck,(Lowerer *)alloc_local,
                   (JitArenaAllocator *)fMapTest_local);
  bVar2 = instrReturn._7_1_;
  pCVar4 = Func::GetCloner((Func *)__prevInstrCheck);
  pCVar4->clonedInstrGetOrigArgSlotSym = (bool)(bVar2 & 1);
  instrStop = (Instr *)0x0;
  if (instrAfter_local == (Instr *)0x0) {
    local_90 = (Instr *)0x0;
  }
  else {
    local_90 = instrAfter_local->m_next;
  }
  instr = local_90;
  instrClone = instrLast_local;
  do {
    if (instrClone == instr) {
      Func::EndClone((Func *)__prevInstrCheck);
      return (Instr *)topFunc;
    }
    if ((instrStop != (Instr *)0x0) && (instrStop->m_next != instrClone)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                         ,0x2bd,"(__prevInstrCheck == nullptr || __prevInstrCheck->m_next == instr)"
                         ,"Modifying instr list but not using EDITING iterator!");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    instrStop = instrClone;
    instrLabel = (LabelInstr *)Clone(instrClone);
    InsertAfter((Instr *)lowerer_local,(Instr *)instrLabel);
    lowerer_local = (Lowerer *)instrLabel;
    instrClone->field_0x38 = instrClone->field_0x38 & 0xf7 | 8;
    bVar3 = (*p_Stack_38)(&instrLabel->super_Instr);
    if (bVar3) {
      local_78 = LabelInstr::New(Label,instrClone->m_func,false);
      InsertBefore(&instrLabel->super_Instr,&local_78->super_Instr);
      this = Func::GetCloneMap((Func *)__prevInstrCheck);
      local_80 = local_78;
      JsUtil::
      BaseDictionary<IR::Instr_*,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::Item(this,&instrClone,(Instr **)&local_80);
    }
    instrClone = instrClone->m_next;
  } while( true );
}

Assistant:

Instr *
Instr::CloneRange(
    Instr * instrStart, Instr * instrLast, Instr * instrAfter, Lowerer *lowerer, JitArenaAllocator * alloc, bool (*fMapTest)(IR::Instr*), bool clonedInstrGetOrigArgSlotSym)
{
    IR::Instr * instrReturn = instrAfter;

    Func * topFunc = instrStart->m_func->GetTopFunc();
    topFunc->BeginClone(lowerer, alloc);
    topFunc->GetCloner()->clonedInstrGetOrigArgSlotSym = clonedInstrGetOrigArgSlotSym;

    FOREACH_INSTR_IN_RANGE(instr, instrStart, instrLast)
    {
        Instr * instrClone = instr->Clone();
        instrAfter->InsertAfter(instrClone);
        instrAfter = instrClone;
        instr->isCloned = true;
        if (fMapTest(instrClone))
        {
            IR::LabelInstr *instrLabel = IR::LabelInstr::New(Js::OpCode::Label, instr->m_func);
            instrClone->InsertBefore(instrLabel);
            topFunc->GetCloneMap()->Item(instr, instrLabel);
        }
    }
    NEXT_INSTR_IN_RANGE;

    topFunc->EndClone();

    return instrReturn;
}